

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picklpf.c
# Opt level: O2

int64_t try_filter_frame(YV12_BUFFER_CONFIG *sd,AV1_COMP *cpi,int filt_level,int partial_frame,
                        int plane,int dir)

{
  int64_t iVar1;
  int iVar2;
  uint lpf_opt_level;
  
  iVar2 = filt_level;
  if (dir == 0 && plane == 0) {
    iVar2 = (cpi->common).lf.filter_level[1];
  }
  if (dir == 1 && plane == 0) {
    filt_level = (cpi->common).lf.filter_level[0];
  }
  else {
    if (plane == 2) {
      (cpi->common).lf.filter_level_v = filt_level;
      goto LAB_001e1955;
    }
    if (plane == 1) {
      (cpi->common).lf.filter_level_u = filt_level;
      goto LAB_001e1955;
    }
  }
  (cpi->common).lf.filter_level[0] = filt_level;
  (cpi->common).lf.filter_level[1] = iVar2;
LAB_001e1955:
  if ((cpi->sf).tx_sf.inter_tx_size_search_init_depth_rect < 1) {
    lpf_opt_level = 0;
  }
  else {
    lpf_opt_level = (uint)(0 < (cpi->sf).tx_sf.inter_tx_size_search_init_depth_sqr);
  }
  av1_loop_filter_frame_mt
            (&((cpi->common).cur_frame)->buf,&cpi->common,&(cpi->td).mb.e_mbd,plane,plane + 1,
             partial_frame,(cpi->mt_info).workers,(cpi->mt_info).num_mod_workers[5],
             &(cpi->mt_info).lf_row_sync,lpf_opt_level);
  iVar1 = aom_get_sse_plane(sd,&((cpi->common).cur_frame)->buf,plane,
                            (uint)((cpi->common).seq_params)->use_highbitdepth);
  yv12_copy_plane(&cpi->last_frame_uf,&((cpi->common).cur_frame)->buf,plane);
  return iVar1;
}

Assistant:

static int64_t try_filter_frame(const YV12_BUFFER_CONFIG *sd,
                                AV1_COMP *const cpi, int filt_level,
                                int partial_frame, int plane, int dir) {
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  int num_workers = mt_info->num_mod_workers[MOD_LPF];
  AV1_COMMON *const cm = &cpi->common;
  int64_t filt_err;

  assert(plane >= 0 && plane <= 2);
  int filter_level[2] = { filt_level, filt_level };
  if (plane == 0 && dir == 0) filter_level[1] = cm->lf.filter_level[1];
  if (plane == 0 && dir == 1) filter_level[0] = cm->lf.filter_level[0];

  // set base filters for use of get_filter_level (av1_loopfilter.c) when in
  // DELTA_LF mode
  switch (plane) {
    case 0:
      cm->lf.filter_level[0] = filter_level[0];
      cm->lf.filter_level[1] = filter_level[1];
      break;
    case 1: cm->lf.filter_level_u = filter_level[0]; break;
    case 2: cm->lf.filter_level_v = filter_level[0]; break;
  }

  // lpf_opt_level = 1 : Enables dual/quad loop-filtering.
  int lpf_opt_level = is_inter_tx_size_search_level_one(&cpi->sf.tx_sf);

  av1_loop_filter_frame_mt(&cm->cur_frame->buf, cm, &cpi->td.mb.e_mbd, plane,
                           plane + 1, partial_frame, mt_info->workers,
                           num_workers, &mt_info->lf_row_sync, lpf_opt_level);

  filt_err = aom_get_sse_plane(sd, &cm->cur_frame->buf, plane,
                               cm->seq_params->use_highbitdepth);

  // Re-instate the unfiltered frame
  yv12_copy_plane(&cpi->last_frame_uf, &cm->cur_frame->buf, plane);

  return filt_err;
}